

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printArray(JSPrinter *this,Ref node)

{
  size_t sVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong uVar4;
  Value *local_38;
  Ref node_local;
  Ref args;
  
  local_38 = node.inst;
  maybeSpace(this,'[');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '[';
  plVar2 = (long *)cashew::Ref::operator[]((uint)&local_38);
  node_local.inst = (Value *)*plVar2;
  if ((node_local.inst)->type == Array) {
    uVar4 = 0;
    do {
      if (((((node_local.inst)->field_1).arr)->
          super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements <= uVar4) {
        maybeSpace(this,']');
        ensure(this,1);
        sVar1 = this->used;
        this->used = sVar1 + 1;
        this->buffer[sVar1] = ']';
        return;
      }
      if (uVar4 != 0) {
        if (this->pretty == true) {
          emit(this,", ");
        }
        else {
          maybeSpace(this,',');
          ensure(this,1);
          sVar1 = this->used;
          this->used = sVar1 + 1;
          this->buffer[sVar1] = ',';
        }
      }
      puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&node_local);
      print(this,(Value *)*puVar3);
      uVar4 = uVar4 + 1;
    } while ((node_local.inst)->type == Array);
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x19a,"size_t cashew::Value::size()");
}

Assistant:

void printArray(Ref node) {
    emit('[');
    Ref args = node[1];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        (pretty ? emit(", ") : emit(','));
      }
      print(args[i]);
    }
    emit(']');
  }